

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

SearchResult<absl::lts_20240722::container_internal::btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_&,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_*>,_false>
 __thiscall
absl::lts_20240722::container_internal::
btree<absl::lts_20240722::container_internal::map_params<std::pair<google::protobuf::Descriptor_const*,int>,google::protobuf::FieldDescriptor_const*,std::less<std::pair<google::protobuf::Descriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::Descriptor_const*,int>const,google::protobuf::FieldDescriptor_const*>>,256,false>>
::internal_locate<std::pair<google::protobuf::Descriptor_const*,int>>
          (btree<absl::lts_20240722::container_internal::map_params<std::pair<google::protobuf::Descriptor_const*,int>,google::protobuf::FieldDescriptor_const*,std::less<std::pair<google::protobuf::Descriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::Descriptor_const*,int>const,google::protobuf::FieldDescriptor_const*>>,256,false>>
           *this,pair<const_google::protobuf::Descriptor_*,_int> *key)

{
  bool bVar1;
  SearchResult<unsigned_long,_false> SVar2;
  btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
  *this_00;
  SearchResult<absl::lts_20240722::container_internal::btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_&,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_*>,_false>
  SVar3;
  
  this_00 = *(btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
              **)this;
  btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
  ::start(this_00);
  while( true ) {
    SVar2 = btree_node<absl::lts_20240722::container_internal::map_params<std::pair<google::protobuf::Descriptor_const*,int>,google::protobuf::FieldDescriptor_const*,std::less<std::pair<google::protobuf::Descriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::Descriptor_const*,int>const,google::protobuf::FieldDescriptor_const*>>,256,false>>
            ::
            binary_search<std::pair<google::protobuf::Descriptor_const*,int>,absl::lts_20240722::container_internal::key_compare_adapter<std::less<std::pair<google::protobuf::Descriptor_const*,int>>,std::pair<google::protobuf::Descriptor_const*,int>>::checked_compare>
                      ((btree_node<absl::lts_20240722::container_internal::map_params<std::pair<google::protobuf::Descriptor_const*,int>,google::protobuf::FieldDescriptor_const*,std::less<std::pair<google::protobuf::Descriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::Descriptor_const*,int>const,google::protobuf::FieldDescriptor_const*>>,256,false>>
                        *)this_00,key,(checked_compare *)(this + 8));
    bVar1 = btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
            ::is_leaf(this_00);
    if (bVar1) break;
    this_00 = btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
              ::child(this_00,(field_type)SVar2.value);
  }
  SVar3.value._8_8_ = SVar2.value & 0xffffffff;
  SVar3.value.node_ = this_00;
  return (SearchResult<absl::lts_20240722::container_internal::btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_&,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_*>,_false>
          )SVar3.value;
}

Assistant:

inline auto btree<P>::internal_locate(const K &key) const
    -> SearchResult<iterator, is_key_compare_to::value> {
  iterator iter(const_cast<node_type *>(root()));
  for (;;) {
    SearchResult<size_type, is_key_compare_to::value> res =
        iter.node_->lower_bound(key, key_comp());
    iter.position_ = static_cast<int>(res.value);
    if (res.IsEq()) {
      return {iter, MatchKind::kEq};
    }
    // Note: in the non-key-compare-to case, we don't need to walk all the way
    // down the tree if the keys are equal, but determining equality would
    // require doing an extra comparison on each node on the way down, and we
    // will need to go all the way to the leaf node in the expected case.
    if (iter.node_->is_leaf()) {
      break;
    }
    iter.node_ = iter.node_->child(static_cast<field_type>(iter.position_));
  }
  // Note: in the non-key-compare-to case, the key may actually be equivalent
  // here (and the MatchKind::kNe is ignored).
  return {iter, MatchKind::kNe};
}